

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

void __thiscall TreeModel::setFixed(TreeModel *this,UModelIndex *index,bool fixed)

{
  bool bVar1;
  TreeItem *pTVar2;
  TreeItem *this_00;
  UModelIndex local_40;
  TreeItem *local_28;
  TreeItem *item;
  UModelIndex *pUStack_18;
  bool fixed_local;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  item._7_1_ = fixed;
  pUStack_18 = index;
  index_local = (UModelIndex *)this;
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    local_28 = (TreeItem *)UModelIndex::internalPointer(pUStack_18);
    TreeItem::setFixed(local_28,(bool)(item._7_1_ & 1));
    pTVar2 = TreeItem::parent(local_28);
    if (pTVar2 != (TreeItem *)0x0) {
      if ((item._7_1_ & 1) != 0) {
        bVar1 = TreeItem::compressed(local_28);
        if (bVar1) {
          pTVar2 = TreeItem::parent(local_28);
          bVar1 = TreeItem::compressed(pTVar2);
          pTVar2 = local_28;
          if (!bVar1) {
            this_00 = TreeItem::parent(local_28);
            bVar1 = TreeItem::fixed(this_00);
            TreeItem::setFixed(pTVar2,bVar1);
            return;
          }
        }
        UModelIndex::parent(&local_40,pUStack_18);
        setFixed(this,&local_40,true);
      }
      dataChanged(this,pUStack_18,pUStack_18);
    }
  }
  return;
}

Assistant:

void TreeModel::setFixed(const UModelIndex &index, const bool fixed)
{
    if (!index.isValid())
        return;
    
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    item->setFixed(fixed);
    
    if (!item->parent())
        return;
    
    if (fixed) {
        // Special handling for uncompressed to compressed boundary
        if (item->compressed() && item->parent()->compressed() == FALSE) {
            item->setFixed(item->parent()->fixed());
            return;
        }
        
        // Propagate fixed flag until root
        setFixed(index.parent(), true);
    }
    
    emit dataChanged(index, index);
}